

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meow_hash_x64_aesni.h
# Opt level: O2

__m128i MeowHash(void *Seed128Init,unsigned_long_long Len,void *SourceInit)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  uchar *puVar3;
  uchar *rax;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  __m128i alVar27;
  
  auVar26 = ZEXT1664(MeowDefaultSeed._0_16_);
  auVar20 = ZEXT1664(MeowDefaultSeed._16_16_);
  auVar18 = ZEXT1664(MeowDefaultSeed._32_16_);
  auVar15 = ZEXT1664(MeowDefaultSeed._48_16_);
  auVar13 = ZEXT1664(MeowDefaultSeed._64_16_);
  auVar11 = ZEXT1664(MeowDefaultSeed._80_16_);
  auVar23 = ZEXT1664(MeowDefaultSeed._96_16_);
  auVar8 = ZEXT1664(MeowDefaultSeed._112_16_);
  uVar2 = (ulong)Seed128Init >> 8;
  uVar4 = (uint)Seed128Init;
  pauVar1 = (undefined1 (*) [16])Len;
  if (Seed128Init < (void *)0x40000) {
    pauVar1 = (undefined1 (*) [16])(Len + 0xf0);
    while( true ) {
      auVar16 = auVar18._0_16_;
      auVar24 = auVar26._0_16_;
      auVar7 = auVar8._0_16_;
      auVar9 = auVar11._0_16_;
      auVar19 = auVar20._0_16_;
      auVar12 = auVar13._0_16_;
      auVar14 = auVar15._0_16_;
      auVar21 = auVar23._0_16_;
      bVar6 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar6) break;
      auVar24 = aesdec(auVar24,auVar12);
      auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[-0xf] + 1));
      auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar1[-0xf] + 0xf));
      auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar1[-0xd] + 1));
      auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(pauVar1[-0xd] + 0xf));
      auVar24 = vpaddq_avx(auVar24,*(undefined1 (*) [16])(pauVar1[-0xb] + 0xf));
      auVar12 = aesdec(auVar12 ^ pauVar1[-0xf],auVar19);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[-0xb] + 1));
      auVar19 = aesdec(auVar19 ^ pauVar1[-0xe],auVar9);
      auVar19 = vpaddq_avx(auVar19,*(undefined1 (*) [16])(pauVar1[-9] + 0xf));
      auVar9 = aesdec(auVar9 ^ pauVar1[-0xd],auVar16);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[-9] + 1));
      auVar16 = aesdec(auVar16 ^ pauVar1[-0xc],auVar21);
      auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[-7] + 0xf));
      auVar21 = aesdec(auVar21 ^ pauVar1[-0xb],auVar14);
      auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar1[-7] + 1));
      auVar14 = aesdec(auVar14 ^ pauVar1[-10],auVar7);
      auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar1[-5] + 0xf));
      auVar7 = aesdec(auVar7 ^ pauVar1[-9],auVar12);
      auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(pauVar1[-5] + 1));
      auVar12 = aesdec(auVar12 ^ pauVar1[-8],auVar24);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[-3] + 0xf));
      auVar13 = ZEXT1664(auVar12);
      auVar12 = aesdec(auVar24 ^ pauVar1[-7],auVar9);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[-3] + 1));
      auVar9 = aesdec(auVar9 ^ pauVar1[-6],auVar19);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[-1] + 0xf));
      auVar11 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar19 ^ pauVar1[-5],auVar21);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[-1] + 1));
      auVar20 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar21 ^ pauVar1[-4],auVar16);
      auVar23 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar16 ^ pauVar1[-3],auVar7);
      auVar18 = ZEXT1664(auVar9);
      auVar7 = aesdec(auVar7 ^ pauVar1[-2],auVar14);
      auVar8 = ZEXT1664(auVar7);
      auVar7 = aesdec(auVar14 ^ pauVar1[-1],auVar12);
      auVar15 = ZEXT1664(auVar7);
      auVar26 = ZEXT1664(auVar12 ^ *pauVar1);
      pauVar1 = pauVar1 + 0x10;
    }
    pauVar1 = (undefined1 (*) [16])((uVar4 & 0x3ff00) + Len);
  }
  else {
    while( true ) {
      auVar16 = auVar18._0_16_;
      auVar24 = auVar26._0_16_;
      auVar7 = auVar8._0_16_;
      auVar9 = auVar11._0_16_;
      auVar19 = auVar20._0_16_;
      auVar12 = auVar13._0_16_;
      auVar14 = auVar15._0_16_;
      auVar21 = auVar23._0_16_;
      bVar6 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar6) break;
      auVar24 = aesdec(auVar24,auVar12);
      auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(*pauVar1 + 1));
      auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(*pauVar1 + 0xf));
      auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar1[2] + 1));
      auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(pauVar1[2] + 0xf));
      auVar24 = vpaddq_avx(auVar24,*(undefined1 (*) [16])(pauVar1[4] + 0xf));
      auVar12 = aesdec(auVar12 ^ *pauVar1,auVar19);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[4] + 1));
      auVar19 = aesdec(auVar19 ^ pauVar1[1],auVar9);
      auVar19 = vpaddq_avx(auVar19,*(undefined1 (*) [16])(pauVar1[6] + 0xf));
      auVar9 = aesdec(auVar9 ^ pauVar1[2],auVar16);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[6] + 1));
      auVar16 = aesdec(auVar16 ^ pauVar1[3],auVar21);
      auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[8] + 0xf));
      auVar21 = aesdec(auVar21 ^ pauVar1[4],auVar14);
      auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar1[8] + 1));
      auVar14 = aesdec(auVar14 ^ pauVar1[5],auVar7);
      auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar1[10] + 0xf));
      auVar7 = aesdec(auVar7 ^ pauVar1[6],auVar12);
      auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(pauVar1[10] + 1));
      auVar12 = aesdec(auVar12 ^ pauVar1[7],auVar24);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[0xc] + 0xf));
      auVar13 = ZEXT1664(auVar12);
      auVar12 = aesdec(auVar24 ^ pauVar1[8],auVar9);
      auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[0xc] + 1));
      auVar9 = aesdec(auVar9 ^ pauVar1[9],auVar19);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[0xe] + 0xf));
      auVar11 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar19 ^ pauVar1[10],auVar21);
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[0xe] + 1));
      auVar20 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar21 ^ pauVar1[0xb],auVar16);
      auVar23 = ZEXT1664(auVar9);
      auVar9 = aesdec(auVar16 ^ pauVar1[0xc],auVar7);
      auVar18 = ZEXT1664(auVar9);
      auVar7 = aesdec(auVar7 ^ pauVar1[0xd],auVar14);
      auVar8 = ZEXT1664(auVar7);
      auVar7 = aesdec(auVar14 ^ pauVar1[0xe],auVar12);
      auVar15 = ZEXT1664(auVar7);
      auVar26 = ZEXT1664(auVar12 ^ pauVar1[0xf]);
      pauVar1 = pauVar1 + 0x10;
    }
  }
  auVar10 = (undefined1  [16])0x0;
  uVar2 = ((ulong)Seed128Init & 0xfffffffffffffff0) + Len;
  puVar3 = (uchar *)(ulong)(uVar4 & 0xf);
  if (((ulong)Seed128Init & 0xf) != 0) {
    puVar3 = "";
    uVar5 = 0;
    if (((Len - 1) + (long)Seed128Init | 0xfff) - 0x10 < uVar2) {
      uVar5 = (ulong)((uint)uVar2 & 0xf);
    }
    auVar10 = vpshufb_avx(*(undefined1 (*) [16])(uVar2 - uVar5),*(undefined1 (*) [16])("" + uVar5));
    auVar10 = vpand_avx(auVar10,*(undefined1 (*) [16])(MeowMaskLen + (0x10 - (ulong)(uVar4 & 0xf))))
    ;
  }
  if (((ulong)Seed128Init & 0x10) == 0) {
    auVar22 = (undefined1  [16])0x0;
    auVar17 = auVar10;
  }
  else {
    auVar17 = *(undefined1 (*) [16])(uVar2 - 0x10);
    auVar22 = auVar10;
  }
  auVar10 = vpalignr_avx(auVar17,auVar22,0xf);
  uVar4 = uVar4 >> 5 & 7;
  auVar21 = vpaddq_avx(auVar10,auVar21);
  auVar10 = vpalignr_avx(auVar17,auVar22,1);
  auVar10 = vpaddq_avx(auVar10,auVar16);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = Seed128Init;
  auVar16 = vpsrlq_avx(auVar25,8);
  auVar14 = vpaddq_avx(auVar14,auVar16);
  auVar16 = aesdec(auVar24,auVar12);
  auVar12 = aesdec(auVar17 ^ auVar12,auVar19);
  auVar19 = aesdec(auVar22 ^ auVar19,auVar9);
  auVar9 = aesdec(auVar9,auVar10);
  auVar10 = auVar10 ^ auVar25;
  if (uVar4 != 0) {
    auVar10 = aesdec(auVar10,auVar21);
    auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(*pauVar1 + 0xf));
    auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(*pauVar1 + 1));
    auVar21 = aesdec(auVar21 ^ *pauVar1,auVar14);
    auVar14 = auVar14 ^ pauVar1[1];
    if (uVar4 != 1) {
      auVar14 = aesdec(auVar14,auVar7);
      auVar19 = vpaddq_avx(auVar19,*(undefined1 (*) [16])(pauVar1[2] + 0xf));
      auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[2] + 1));
      auVar7 = aesdec(auVar7 ^ pauVar1[2],auVar12);
      auVar12 = auVar12 ^ pauVar1[3];
      if (uVar4 != 2) {
        auVar12 = aesdec(auVar12,auVar16);
        auVar10 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar1[4] + 0xf));
        auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar1[4] + 1));
        auVar16 = aesdec(auVar16 ^ pauVar1[4],auVar9);
        auVar9 = auVar9 ^ pauVar1[5];
        if (uVar4 != 3) {
          auVar9 = aesdec(auVar9,auVar19);
          auVar14 = vpaddq_avx(auVar14,*(undefined1 (*) [16])(pauVar1[6] + 0xf));
          auVar7 = vpaddq_avx(auVar7,*(undefined1 (*) [16])(pauVar1[6] + 1));
          auVar19 = aesdec(auVar19 ^ pauVar1[6],auVar21);
          auVar21 = auVar21 ^ pauVar1[7];
          if (uVar4 != 4) {
            auVar21 = aesdec(auVar21,auVar10);
            auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(pauVar1[8] + 0xf));
            auVar16 = vpaddq_avx(auVar16,*(undefined1 (*) [16])(pauVar1[8] + 1));
            auVar10 = aesdec(auVar10 ^ pauVar1[8],auVar7);
            auVar7 = auVar7 ^ pauVar1[9];
            if (uVar4 != 5) {
              auVar7 = aesdec(auVar7,auVar14);
              auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pauVar1[10] + 0xf));
              auVar19 = vpaddq_avx(auVar19,*(undefined1 (*) [16])(pauVar1[10] + 1));
              auVar14 = aesdec(auVar14 ^ pauVar1[10],auVar16);
              auVar16 = auVar16 ^ pauVar1[0xb];
              if (uVar4 != 6) {
                auVar16 = aesdec(auVar16,auVar12);
                auVar21 = vpaddq_avx(auVar21,*(undefined1 (*) [16])(pauVar1[0xc] + 0xf));
                auVar10 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pauVar1[0xc] + 1));
                auVar12 = aesdec(auVar12 ^ pauVar1[0xc],auVar19);
                auVar19 = auVar19 ^ pauVar1[0xd];
              }
            }
          }
        }
      }
    }
  }
  auVar17 = aesdec(auVar16,auVar12);
  auVar16 = vpaddq_avx(auVar19,auVar9);
  auVar9 = vpaddq_avx(auVar9,auVar21);
  auVar24 = aesdec(auVar12 ^ auVar21,auVar16);
  auVar12 = vpaddq_avx(auVar10,auVar21);
  auVar19 = vpaddq_avx(auVar21,auVar7);
  auVar25 = aesdec(auVar16 ^ auVar10,auVar9);
  auVar10 = aesdec(auVar9 ^ auVar7,auVar12);
  auVar9 = vpaddq_avx(auVar14,auVar7);
  auVar16 = aesdec(auVar12 ^ auVar14,auVar19);
  auVar7 = vpaddq_avx(auVar17,auVar7);
  auVar22 = aesdec(auVar17 ^ auVar19,auVar9);
  auVar12 = vpaddq_avx(auVar24,auVar17);
  auVar21 = aesdec(auVar24 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar25,auVar17);
  auVar14 = aesdec(auVar25 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar10,auVar25);
  auVar19 = aesdec(auVar10 ^ auVar12,auVar9);
  auVar12 = vpaddq_avx(auVar16,auVar25);
  auVar24 = aesdec(auVar16 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar22,auVar16);
  auVar10 = aesdec(auVar22 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar21,auVar16);
  auVar22 = aesdec(auVar21 ^ auVar12,auVar9);
  auVar12 = vpaddq_avx(auVar14,auVar21);
  auVar17 = aesdec(auVar14 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar19,auVar21);
  auVar16 = aesdec(auVar19 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar24,auVar19);
  auVar14 = aesdec(auVar24 ^ auVar12,auVar9);
  auVar12 = vpaddq_avx(auVar10,auVar19);
  auVar21 = aesdec(auVar10 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar22,auVar10);
  auVar24 = aesdec(auVar22 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar17,auVar10);
  auVar19 = aesdec(auVar17 ^ auVar12,auVar9);
  auVar12 = vpaddq_avx(auVar16,auVar17);
  auVar22 = aesdec(auVar16 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar14,auVar17);
  auVar10 = aesdec(auVar14 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar21,auVar14);
  auVar16 = aesdec(auVar21 ^ auVar12,auVar9);
  auVar12 = vpaddq_avx(auVar24,auVar14);
  auVar21 = aesdec(auVar24 ^ auVar9,auVar7);
  auVar9 = vpaddq_avx(auVar19,auVar24);
  auVar19 = aesdec(auVar19 ^ auVar7,auVar12);
  auVar7 = vpaddq_avx(auVar22,auVar24);
  auVar14 = aesdec(auVar22 ^ auVar12,auVar9);
  auVar7 = vpaddq_avx(auVar7,auVar16);
  auVar9 = vpaddq_avx(auVar21,auVar10 ^ auVar9);
  auVar12 = vpaddq_avx(auVar19,auVar22);
  auVar14 = vpaddq_avx(auVar14,auVar10);
  vpaddq_avx(auVar14 ^ auVar9,auVar12 ^ auVar7);
  alVar27[1] = (longlong)puVar3;
  alVar27[0] = (longlong)pauVar1;
  return alVar27;
}

Assistant:

static meow_u128
MeowHash(void *Seed128Init, meow_umm Len, void *SourceInit)
{
    meow_u128 xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7; // NOTE(casey): xmm0-xmm7 are the hash accumulation lanes
    meow_u128 xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15; // NOTE(casey): xmm8-xmm15 hold values to be appended (residual, length)
    
    meow_u8 *rax = (meow_u8 *)SourceInit;
    meow_u8 *rcx = (meow_u8 *)Seed128Init;
    
    //
	// NOTE(casey): Seed the eight hash registers
    //
    
    movdqu(xmm0, rcx + 0x00);
    movdqu(xmm1, rcx + 0x10);
    movdqu(xmm2, rcx + 0x20);
    movdqu(xmm3, rcx + 0x30);
    
    movdqu(xmm4, rcx + 0x40);
    movdqu(xmm5, rcx + 0x50);
    movdqu(xmm6, rcx + 0x60);
    movdqu(xmm7, rcx + 0x70);
    
    MEOW_DUMP_STATE("Seed", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 256-byte blocks
    //
    
    meow_umm BlockCount = (Len >> 8);
    if(BlockCount > MEOW_PREFETCH_LIMIT)
    {
        // NOTE(casey): For large input, modern Intel x64's can't hit full speed without prefetching, so we use this loop
        while(BlockCount--)
        {
            prefetcht0(rax + MEOW_PREFETCH + 0x00);
            prefetcht0(rax + MEOW_PREFETCH + 0x40);
            prefetcht0(rax + MEOW_PREFETCH + 0x80);
            prefetcht0(rax + MEOW_PREFETCH + 0xc0);
            
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    else
    {
        // NOTE(casey): For small input, modern Intel x64's can't hit full speed _with_ prefetching (because of port pressure), so we use this loop.
        while(BlockCount--)
        {
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    
    MEOW_DUMP_STATE("PostBlocks", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Load any less-than-32-byte residual
    //
    
    pxor_clear(xmm9, xmm9);
    pxor_clear(xmm11, xmm11);
    
    //
    // TODO(casey): I need to put more thought into how the end-of-buffer stuff is actually working out here,
    // because I _think_ it may be possible to remove the first branch (on Len8) and let the mask zero out the
    // result, but it would take a little thought to make sure it couldn't read off the end of the buffer due
    // to the & 0xf on the align computation.
    //
    
    // NOTE(casey): First, we have to load the part that is _not_ 16-byte aligned
    meow_u8 *Last = (meow_u8 *)SourceInit + (Len & ~0xf);
    int unsigned Len8 = (Len & 0xf);
    if(Len8)
    {
        // NOTE(casey): Load the mask early
        movdqu(xmm8, &MeowMaskLen[0x10 - Len8]);
        
        meow_u8 *LastOk = (meow_u8*)((((meow_umm)(((meow_u8 *)SourceInit)+Len - 1)) | (MEOW_PAGESIZE - 1)) - 16);
        int Align = (Last > LastOk) ? ((int)(meow_umm)Last) & 0xf : 0;
        movdqu(xmm10, &MeowShiftAdjust[Align]);
        movdqu(xmm9, Last - Align);
        pshufb(xmm9, xmm10);
        
        // NOTE(jeffr): and off the extra bytes
        pand(xmm9, xmm8);
    }
    
    // NOTE(casey): Next, we have to load the part that _is_ 16-byte aligned
    if(Len & 0x10)
    {
        xmm11 = xmm9;
        movdqu(xmm9, Last - 0x10);
    }
    
    //
    // NOTE(casey): Construct the residual and length injests
    //
    
    xmm8 = xmm9;
    xmm10 = xmm9;
    palignr(xmm8, xmm11, 15);
    palignr(xmm10, xmm11, 1);
    
    // NOTE(casey): We have room for a 128-bit nonce and a 64-bit none here, but
    // the decision was made to leave them zero'd so as not to confuse people
    // about hwo to use them or what security implications they had.
    pxor_clear(xmm12, xmm12);
    pxor_clear(xmm13, xmm13);
    pxor_clear(xmm14, xmm14);
    movq(xmm15, Len);
    palignr(xmm12, xmm15, 15);
    palignr(xmm14, xmm15, 1);
    
    MEOW_DUMP_STATE("Residuals", xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15, 0);
    
    // NOTE(casey): To maintain the mix-down pattern, we always Meow Mix the less-than-32-byte residual, even if it was empty
    MEOW_MIX_REG(xmm0, xmm4, xmm6, xmm1, xmm2,  xmm8, xmm9, xmm10, xmm11);
    
    // NOTE(casey): Append the length, to avoid problems with our 32-byte padding
    MEOW_MIX_REG(xmm1, xmm5, xmm7, xmm2, xmm3,  xmm12, xmm13, xmm14, xmm15);
    
    MEOW_DUMP_STATE("PostAppend", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 32-byte blocks
    //
    int unsigned LaneCount = (Len >> 5) & 0x7;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x00); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x20); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x40); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0x60); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0x80); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xa0); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0xc0); --LaneCount;
    
    //
    // NOTE(casey): Mix the eight lanes down to one 128-bit hash
    //
    
    MixDown:
    
    MEOW_DUMP_STATE("PostLanes", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    MEOW_SHUFFLE(xmm4, xmm5, xmm6, xmm0, xmm1, xmm2);
    MEOW_SHUFFLE(xmm5, xmm6, xmm7, xmm1, xmm2, xmm3);
    MEOW_SHUFFLE(xmm6, xmm7, xmm0, xmm2, xmm3, xmm4);
    MEOW_SHUFFLE(xmm7, xmm0, xmm1, xmm3, xmm4, xmm5);
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    
    MEOW_DUMP_STATE("PostMix", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    paddq(xmm0, xmm2);
    paddq(xmm1, xmm3);
    paddq(xmm4, xmm6);
    paddq(xmm5, xmm7);
    pxor(xmm0, xmm1);
    pxor(xmm4, xmm5);
    paddq(xmm0, xmm4);
    
    MEOW_DUMP_STATE("PostFold", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    return(xmm0);
}